

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O0

FILE * fsbridge::fopen(char *__filename,char *__modes)

{
  long lVar1;
  value_type *__filename_00;
  FILE *pFVar2;
  long in_FS_OFFSET;
  path *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __filename_00 = std::filesystem::__cxx11::path::c_str(in_stack_ffffffffffffffd8);
  pFVar2 = ::fopen(__filename_00,__modes);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pFVar2;
  }
  __stack_chk_fail();
}

Assistant:

FILE *fopen(const fs::path& p, const char *mode)
{
#ifndef WIN32
    return ::fopen(p.c_str(), mode);
#else
    std::wstring_convert<std::codecvt_utf8_utf16<wchar_t>,wchar_t> utf8_cvt;
    return ::_wfopen(p.wstring().c_str(), utf8_cvt.from_bytes(mode).c_str());
#endif
}